

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O2

void __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::configureProgram
          (TextureBufferActiveUniformValidationVSFS *this,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params,
          GLuint *texIds)

{
  GLuint GVar1;
  pointer pTVar2;
  code *pcVar3;
  int iVar4;
  deUint32 dVar5;
  uint uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  ulong uVar8;
  undefined8 local_50 [4];
  long lVar7;
  
  iVar4 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  uVar6 = 0;
  while( true ) {
    uVar8 = (ulong)uVar6;
    pTVar2 = (params->
             super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(params->
                       super__Vector_base<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x30) <= uVar8)
    {
      return;
    }
    pcVar3 = *(code **)(lVar7 + 0xb48);
    GVar1 = (this->super_TextureBufferActiveUniformValidation).m_po_id;
    std::__cxx11::string::string((string *)local_50,(string *)&pTVar2[uVar8].m_uniform_name);
    iVar4 = (*pcVar3)(GVar1,local_50[0]);
    std::__cxx11::string::~string((string *)local_50);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error getting uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x22f);
    if (iVar4 == -1) break;
    (**(code **)(lVar7 + 8))(uVar6 + 0x84c0);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error activating texture unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x236);
    (**(code **)(lVar7 + 0xb8))
              ((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_glExtTokens.
               TEXTURE_BUFFER,texIds[uVar8]);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error binding texture object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x238);
    (**(code **)(lVar7 + 0x14f0))(iVar4,uVar6);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"Error setting value for uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                    ,0x23a);
    uVar6 = uVar6 + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Could not get uniform location for active uniform variable",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
             ,0x232);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferActiveUniformValidationVSFS::configureProgram(std::vector<TextureParameters>* params,
																glw::GLuint*					texIds)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (glw::GLuint i = 0; i < params->size(); ++i)
	{
		glw::GLint location = gl.getUniformLocation(m_po_id, (*params)[i].get_uniform_name().c_str());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");
		if (location == -1)
		{
			TCU_FAIL("Could not get uniform location for active uniform variable");
		}

		gl.activeTexture(GL_TEXTURE0 + i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error activating texture unit!");
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, texIds[i]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");
		gl.uniform1i(location, i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform location!");
	}
}